

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O2

HighsCDouble __thiscall
HighsHessian::objectiveCDoubleValue
          (HighsHessian *this,vector<double,_std::allocator<double>_> *solution)

{
  double dVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  HighsCDouble HVar13;
  
  piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->dim_;
  if (this->dim_ < 1) {
    uVar6 = uVar7;
  }
  dVar10 = 0.0;
  dVar9 = 0.0;
  while (uVar7 != uVar6) {
    lVar8 = (long)piVar2[uVar7];
    dVar1 = pdVar3[uVar7];
    dVar11 = dVar1 * 0.5 * pdVar4[lVar8] * dVar1;
    dVar12 = dVar9 + dVar11;
    dVar10 = dVar10 + (dVar9 - (dVar12 - dVar11)) + (dVar11 - (dVar12 - (dVar12 - dVar11)));
    lVar5 = uVar7 + 1;
    uVar7 = uVar7 + 1;
    dVar9 = dVar12;
    while (lVar8 = lVar8 + 1, lVar8 < piVar2[lVar5]) {
      dVar11 = pdVar4[lVar8] * dVar1 *
               pdVar3[(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8]];
      dVar12 = dVar9 + dVar11;
      dVar10 = dVar10 + (dVar9 - (dVar12 - dVar11)) + (dVar11 - (dVar12 - (dVar12 - dVar11)));
      dVar9 = dVar12;
    }
  }
  HVar13.lo = dVar10;
  HVar13.hi = dVar9;
  return HVar13;
}

Assistant:

HighsCDouble HighsHessian::objectiveCDoubleValue(
    const std::vector<double>& solution) const {
  HighsCDouble objective_function_value = HighsCDouble(0);
  for (HighsInt iCol = 0; iCol < this->dim_; iCol++) {
    HighsInt iEl = this->start_[iCol];
    assert(this->index_[iEl] == iCol);
    objective_function_value +=
        0.5 * solution[iCol] * this->value_[iEl] * solution[iCol];
    for (HighsInt iEl = this->start_[iCol] + 1; iEl < this->start_[iCol + 1];
         iEl++)
      objective_function_value +=
          solution[iCol] * this->value_[iEl] * solution[this->index_[iEl]];
  }
  return objective_function_value;
}